

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::sendInLoop(TcpConnection *this,void *data,size_t len)

{
  EventLoop *pEVar1;
  bool bVar2;
  sz_fd sockfd;
  int iVar3;
  LogStream *this_00;
  pointer pCVar4;
  size_t sVar5;
  SourceFile file;
  unsigned_long local_1100;
  enable_shared_from_this<sznet::net::TcpConnection> local_10f8;
  type local_10e8;
  Functor local_10b0;
  size_t local_1090;
  size_t oldLen;
  type local_1078;
  Functor local_1048;
  undefined1 local_1018 [12];
  Logger local_1008;
  byte local_31;
  ulong uStack_30;
  bool faultError;
  size_t remaining;
  sz_ssize_t nwrote;
  size_t len_local;
  void *data_local;
  TcpConnection *this_local;
  
  nwrote = len;
  len_local = (size_t)data;
  data_local = this;
  EventLoop::assertInLoopThread(this->m_loop);
  remaining = 0;
  uStack_30 = nwrote;
  local_31 = 0;
  if (this->m_state == kDisconnected) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_1018,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1018._0_8_;
    file.m_size = local_1018._8_4_;
    Logger::Logger(&local_1008,file,0x7a,WARN);
    this_00 = Logger::stream(&local_1008);
    LogStream::operator<<(this_00,"disconnected, give up writing");
    Logger::~Logger(&local_1008);
  }
  else {
    pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_channel);
    bVar2 = Channel::isWriting(pCVar4);
    if ((!bVar2) && (sVar5 = Buffer::readableBytes(&this->m_outputBuffer), sVar5 == 0)) {
      pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
               operator->(&this->m_channel);
      sockfd = Channel::fd(pCVar4);
      remaining = sockets::sz_socket_write(sockfd,(void *)len_local,nwrote);
      if ((long)remaining < 0) {
        remaining = 0;
        iVar3 = sz_getlasterr();
        if ((iVar3 != 4) && (bVar2 = sockets::sz_wouldblock(), !bVar2)) {
          local_31 = 1;
        }
      }
      else {
        (this->m_netStatInfo).m_sendBytes = remaining + (this->m_netStatInfo).m_sendBytes;
        uStack_30 = nwrote - remaining;
        if ((uStack_30 == 0) &&
           (bVar2 = std::function::operator_cast_to_bool((function *)&this->m_writeCompleteCallback)
           , bVar2)) {
          pEVar1 = this->m_loop;
          std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this
                    ((enable_shared_from_this<sznet::net::TcpConnection> *)&oldLen);
          std::
          bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&,std::shared_ptr<sznet::net::TcpConnection>>
                    (&local_1078,&this->m_writeCompleteCallback,
                     (shared_ptr<sznet::net::TcpConnection> *)&oldLen);
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                    ((function<void()> *)&local_1048,&local_1078);
          EventLoop::queueInLoop(pEVar1,&local_1048);
          std::function<void_()>::~function(&local_1048);
          std::
          _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
          ::~_Bind(&local_1078);
          std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
                    ((shared_ptr<sznet::net::TcpConnection> *)&oldLen);
        }
      }
    }
    if ((ulong)nwrote < uStack_30) {
      __assert_fail("remaining <= len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                    ,0x97,"void sznet::net::TcpConnection::sendInLoop(const void *, size_t)");
    }
    if (((local_31 & 1) == 0) && (uStack_30 != 0)) {
      local_1090 = Buffer::readableBytes(&this->m_outputBuffer);
      if ((this->m_highWaterMark <= local_1090 + uStack_30) &&
         ((local_1090 < this->m_highWaterMark &&
          (bVar2 = std::function::operator_cast_to_bool((function *)&this->m_highWaterMarkCallback),
          bVar2)))) {
        pEVar1 = this->m_loop;
        std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(&local_10f8);
        local_1100 = local_1090 + uStack_30;
        std::
        bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&,unsigned_long)>&,std::shared_ptr<sznet::net::TcpConnection>,unsigned_long>
                  (&local_10e8,&this->m_highWaterMarkCallback,
                   (shared_ptr<sznet::net::TcpConnection> *)&local_10f8,&local_1100);
        std::function<void()>::
        function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&,unsigned_long)>(std::shared_ptr<sznet::net::TcpConnection>,unsigned_long)>,void>
                  ((function<void()> *)&local_10b0,&local_10e8);
        EventLoop::queueInLoop(pEVar1,&local_10b0);
        std::function<void_()>::~function(&local_10b0);
        std::
        _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>
        ::~_Bind(&local_10e8);
        std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
                  ((shared_ptr<sznet::net::TcpConnection> *)&local_10f8);
      }
      Buffer::append(&this->m_outputBuffer,(char *)(len_local + remaining),uStack_30);
      pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
               operator->(&this->m_channel);
      bVar2 = Channel::isWriting(pCVar4);
      if (!bVar2) {
        pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
                 operator->(&this->m_channel);
        Channel::enableWriting(pCVar4);
      }
    }
  }
  return;
}

Assistant:

void TcpConnection::sendInLoop(const void* data, size_t len)
{
	m_loop->assertInLoopThread();
	// �ѷ�����
	sz_ssize_t nwrote = 0;
	// ʣ������
	size_t remaining = len;
	// ��������
	bool faultError = false;

	if (m_state == kDisconnected)
	{
		LOG_WARN << "disconnected, give up writing";
		return;
	}

	// û�����ÿ�д�¼� && ���ͻ�����û�����ݣ�����������������
	if (!m_channel->isWriting() && m_outputBuffer.readableBytes() == 0)
	{
		nwrote = sockets::sz_socket_write(m_channel->fd(), data, len);
		if (nwrote >= 0)
		{
			m_netStatInfo.m_sendBytes += nwrote;
			remaining = len - nwrote;
			if (remaining == 0 && m_writeCompleteCallback)
			{
				m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
			}
		}
		// nwrote < 0
		else
		{
			nwrote = 0;
			if (sz_getlasterr() != sz_err_eintr && !sockets::sz_wouldblock())
			{
				faultError = true;
			}
		}
	}
	
	// ȫ��������/���˲���/û����ȥ/������
	assert(remaining <= len);
	if (!faultError && remaining > 0)
	{
		size_t oldLen = m_outputBuffer.readableBytes();
		// �������ݻ�����û�г�����ˮλ�ߣ����Ҵ�����������������ʧ�ܣ����뻺�����󳬹���ˮλ�ߺ����лص�
		if (oldLen + remaining >= m_highWaterMark && oldLen < m_highWaterMark && m_highWaterMarkCallback)
		{
			m_loop->queueInLoop(std::bind(m_highWaterMarkCallback, shared_from_this(), oldLen + remaining));
		}
		m_outputBuffer.append(static_cast<const char*>(data) + nwrote, remaining);
		// ע����д�¼�
		if (!m_channel->isWriting())
		{
			m_channel->enableWriting();
		}
	}
}